

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void heap_init(long n)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  
  allocate_heap(n);
  _heap_size = 0;
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  plVar1 = &_heap->idx;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *plVar1 = 0;
    plVar1 = plVar1 + 3;
  }
  return;
}

Assistant:

void  heap_init( long  n )
{
  register long  p;

  allocate_heap( n );
  _heap_size = 0;
  for( p = 0;  p < n;  p++ )
  { 
    heap_idx( p ) = 0;
  }
 
}